

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
::fulfill(AdapterPromiseNode<kj::AuthenticatedStream,_kj::(anonymous_namespace)::AggregateConnectionReceiver::Waiter>
          *this,AuthenticatedStream *value)

{
  ExceptionOr<kj::AuthenticatedStream> local_1d0;
  
  if (this->waiting == true) {
    this->waiting = false;
    ExceptionOr<kj::AuthenticatedStream>::ExceptionOr(&local_1d0,value);
    ExceptionOr<kj::AuthenticatedStream>::operator=(&this->result,&local_1d0);
    ExceptionOr<kj::AuthenticatedStream>::~ExceptionOr(&local_1d0);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }